

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O3

void __thiscall SQCompilation::CodegenVisitor::visitDeclGroup(CodegenVisitor *this,DeclGroup *group)

{
  VarDecl **ppVVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = (long)(group->super_Decl).super_Statement.super_Node._coordinates.lineStart;
  if (lVar2 != -1) {
    SQFuncState::AddLineInfos(this->_fs,lVar2,this->_lineinfo,false);
  }
  uVar3 = (ulong)(group->_decls)._size;
  if (uVar3 != 0) {
    ppVVar1 = (group->_decls)._vals;
    lVar2 = 0;
    do {
      Node::visit<SQCompilation::CodegenVisitor>(*(Node **)((long)ppVVar1 + lVar2),this);
      lVar2 = lVar2 + 8;
    } while (uVar3 << 3 != lVar2);
  }
  return;
}

Assistant:

void CodegenVisitor::visitDeclGroup(DeclGroup *group) {
    addLineNumber(group);
    const auto &declarations = group->declarations();

    for (Decl *d : declarations) {
        d->visit(this);
    }
}